

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

void addPaddingBits(uchar *out,uchar *in,size_t olinebits,size_t ilinebits,uint h)

{
  byte bVar1;
  ulong uVar2;
  long lVar3;
  uint uVar4;
  size_t sVar5;
  ulong uVar6;
  bool bVar7;
  size_t local_50;
  long local_48;
  size_t local_40;
  ulong local_38;
  
  local_48 = olinebits - ilinebits;
  local_38 = 0;
  local_50 = 0;
  local_40 = ilinebits;
  for (uVar4 = 0; uVar4 != h; uVar4 = uVar4 + 1) {
    sVar5 = local_40;
    uVar6 = local_38;
    local_38 = local_38 + local_40;
    while (bVar7 = sVar5 != 0, sVar5 = sVar5 - 1, lVar3 = local_48, bVar7) {
      uVar2 = uVar6 >> 3;
      bVar1 = (byte)uVar6;
      uVar6 = uVar6 + 1;
      setBitOfReversedStream(&local_50,out,(in[uVar2] >> (~bVar1 & 7) & 1) != 0);
    }
    while (lVar3 != 0) {
      bVar1 = ~(byte)local_50 & 7;
      uVar6 = local_50 >> 3;
      local_50 = local_50 + 1;
      out[uVar6] = out[uVar6] & (-2 << bVar1 | 0xfeU >> 8 - bVar1);
      lVar3 = lVar3 + -1;
    }
  }
  return;
}

Assistant:

static void addPaddingBits(unsigned char* out, const unsigned char* in,
                           size_t olinebits, size_t ilinebits, unsigned h)
{
  /*The opposite of the removePaddingBits function
  olinebits must be >= ilinebits*/
  unsigned y;
  size_t diff = olinebits - ilinebits;
  size_t obp = 0, ibp = 0; /*bit pointers*/
  for(y = 0; y != h; ++y)
  {
    size_t x;
    for(x = 0; x < ilinebits; ++x)
    {
      unsigned char bit = readBitFromReversedStream(&ibp, in);
      setBitOfReversedStream(&obp, out, bit);
    }
    /*obp += diff; --> no, fill in some value in the padding bits too, to avoid
    "Use of uninitialised value of size ###" warning from valgrind*/
    for(x = 0; x != diff; ++x) setBitOfReversedStream(&obp, out, 0);
  }
}